

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZString.cpp
# Opt level: O0

string * __thiscall
lzstring::LZString::CompressToBase64(string *__return_storage_ptr__,LZString *this,wstring *input)

{
  undefined8 input_00;
  uint uVar1;
  ulong uVar2;
  allocator<char> local_9d;
  undefined4 local_9c;
  undefined1 local_98 [8];
  string res;
  anon_class_1_0_00000001 local_61;
  GetCharFromIntFunc local_60;
  undefined1 local_40 [8];
  wstring tmp;
  wstring *input_local;
  LZString *this_local;
  
  tmp.field_2._8_8_ = input;
  uVar2 = std::__cxx11::wstring::empty();
  input_00 = tmp.field_2._8_8_;
  if ((uVar2 & 1) == 0) {
    std::function<wchar_t(int)>::
    function<lzstring::LZString::CompressToBase64(std::__cxx11::wstring_const&)::__0,void>
              ((function<wchar_t(int)> *)&local_60,&local_61);
    Compress((wstring *)local_40,this,(wstring *)input_00,6,&local_60);
    std::function<wchar_t_(int)>::~function(&local_60);
    to_string((string *)local_98,(wstring *)local_40);
    uVar1 = std::__cxx11::string::size();
    switch(uVar1 & 3) {
    case 0:
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_98);
      break;
    case 1:
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     "===");
      break;
    case 2:
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     "==");
      break;
    case 3:
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     "=");
      break;
    default:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_9d);
      std::allocator<char>::~allocator(&local_9d);
    }
    local_9c = 1;
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::wstring::~wstring((wstring *)local_40);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LZString::CompressToBase64(const std::wstring &input)
{
	if (input.empty())
		return std::string();

	std::wstring tmp = Compress(input, 6, [](int code) { return kKeyStrBase64[code]; });
	std::string res = to_string(tmp);
	switch (res.size() % 4)
	{
	case 0:
		return res;
	case 1:
		return res + "===";
	case 2:
		return res + "==";
	case 3:
		return res + "=";
	default:
		return "";
	}
}